

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# native_object.h
# Opt level: O1

void __thiscall
mjs::native_object::update_property_attributes
          (native_object *this,char *name,property_attribute attributes)

{
  native_object_property *pnVar1;
  
  pnVar1 = find(this,name);
  if (pnVar1 == (native_object_property *)0x0) {
    __assert_fail("it",
                  "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/src/mjs/native_object.h"
                  ,0x4f,
                  "void mjs::native_object::update_property_attributes(const char *, property_attribute)"
                 );
  }
  if (((attributes & read_only) == none) && (pnVar1->put == (put_func)0x0)) {
    __assert_fail("((attributes & property_attribute::read_only) != property_attribute::none) || it->put"
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/src/mjs/native_object.h"
                  ,0x50,
                  "void mjs::native_object::update_property_attributes(const char *, property_attribute)"
                 );
  }
  pnVar1->attributes = attributes;
  return;
}

Assistant:

void update_property_attributes(const char* name, property_attribute attributes) {
        auto it = find(name);
        assert(it);
        assert(((attributes & property_attribute::read_only) != property_attribute::none) || it->put);
        it->attributes = attributes;
    }